

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall
google::protobuf::SourceCodeInfo_Location::ByteSizeLong(SourceCodeInfo_Location *this)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  InternalMetadataWithArena *metadata;
  SourceCodeInfo_Location *this_00;
  long in_RDI;
  int cached_size;
  int n;
  int i;
  int cached_size_2;
  size_t data_size_1;
  int cached_size_1;
  size_t data_size;
  uint32 cached_has_bits;
  size_t total_size;
  memory_order __b_1;
  memory_order __b;
  int in_stack_ffffffffffffff3c;
  RepeatedField<int> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 uVar5;
  int local_90;
  size_t local_68;
  size_t local_58;
  
  local_68 = 0;
  sVar3 = internal::WireFormatLite::Int32Size(in_stack_ffffffffffffff40);
  if (sVar3 != 0) {
    local_68 = internal::WireFormatLite::Int32Size(0);
    local_68 = local_68 + 1;
  }
  iVar2 = internal::ToCachedSize(sVar3);
  metadata = (InternalMetadataWithArena *)(in_RDI + 0x28);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  *(int *)&(metadata->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_ = iVar2;
  local_68 = sVar3 + local_68;
  sVar3 = internal::WireFormatLite::Int32Size(in_stack_ffffffffffffff40);
  if (sVar3 != 0) {
    sVar4 = internal::WireFormatLite::Int32Size(0);
    local_68 = sVar4 + 1 + local_68;
  }
  iVar2 = internal::ToCachedSize(sVar3);
  this_00 = (SourceCodeInfo_Location *)(in_RDI + 0x40);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar5 = 0;
  *(int *)&((RepeatedPtrFieldBase *)&this_00->super_Message)->arena_ = iVar2;
  iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x5381ae);
  sVar4 = internal::FromIntSize(iVar2);
  local_68 = sVar4 + sVar3 + local_68;
  local_90 = 0;
  iVar2 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x5381d9);
  for (; local_90 < iVar2; local_90 = local_90 + 1) {
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Get((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)this_00,in_stack_ffffffffffffff3c);
    sVar3 = internal::WireFormatLite::StringSize((string *)0x538201);
    local_68 = sVar3 + local_68;
  }
  uVar1 = *(uint *)(in_RDI + 0x10);
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_leading_comments_abi_cxx11_((SourceCodeInfo_Location *)0x53826d);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x538275);
      local_68 = sVar3 + 1 + local_68;
    }
    if ((uVar1 & 2) != 0) {
      _internal_trailing_comments_abi_cxx11_((SourceCodeInfo_Location *)0x538299);
      sVar3 = internal::WireFormatLite::StringSize((string *)0x5382a1);
      local_68 = sVar3 + 1 + local_68;
    }
  }
  if (((uint)*(undefined8 *)(in_RDI + 8) & 1) == 1) {
    local_58 = internal::ComputeUnknownFieldsSize
                         (metadata,CONCAT44(uVar5,in_stack_ffffffffffffff48),(CachedSize *)this_00);
  }
  else {
    internal::ToCachedSize(local_68);
    SetCachedSize(this_00,in_stack_ffffffffffffff3c);
    local_58 = local_68;
  }
  return local_58;
}

Assistant:

size_t SourceCodeInfo_Location::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo.Location)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->path_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<::PROTOBUF_NAMESPACE_ID::int32>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _path_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // repeated int32 span = 2 [packed = true];
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      Int32Size(this->span_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<::PROTOBUF_NAMESPACE_ID::int32>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _span_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // repeated string leading_detached_comments = 6;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(leading_detached_comments_.size());
  for (int i = 0, n = leading_detached_comments_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      leading_detached_comments_.Get(i));
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string leading_comments = 3;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_leading_comments());
    }

    // optional string trailing_comments = 4;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_trailing_comments());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}